

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int __thiscall options::parse(options *this,int argc,char **argv)

{
  vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_> *this_00;
  value_type *__x;
  char cVar1;
  pointer pCVar2;
  pointer pPVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  undefined4 in_register_00000034;
  iterator iVar8;
  iterator iVar9;
  char *pcVar10;
  ostream *poVar11;
  int c;
  PixelMode PVar12;
  int c_1;
  Compression CVar13;
  int iVar14;
  _List_node_base *p_Var15;
  double dVar16;
  Compression compression;
  string i;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  PixelMode local_90;
  int local_8c;
  long *local_88;
  long local_80;
  long local_78 [2];
  vector<PixelMode,_std::allocator<PixelMode>_> *local_68;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_48;
  undefined8 local_40;
  char **local_38;
  
  local_40 = CONCAT44(in_register_00000034,argc);
  this->timing = 7;
  local_38 = argv;
  if (argc == 1) {
    usageMessage((ostream *)&std::cerr,"exrmetrics",true);
    return 1;
  }
  if (argc < 2) {
LAB_00108a39:
    if ((this->inFiles).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->inFiles).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Missing input file\n",0x13);
      usageMessage((ostream *)&std::cerr,"exrmetrics",false);
    }
    else {
      if (((this->outputSizeData != false) || (this->timing != 0)) || (this->outFile != (char *)0x0)
         ) {
        iVar9._M_current =
             (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_88 = (long *)((ulong)local_88 & 0xffffffff00000000);
          if (iVar9._M_current ==
              (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<PixelMode,_std::allocator<PixelMode>_>::_M_realloc_insert<PixelMode>
                      (&this->pixelModes,iVar9,(PixelMode *)&local_88);
          }
          else {
            *iVar9._M_current = PIXELMODE_ORIGINAL;
            (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
        }
        iVar8._M_current =
             (this->compressions).
             super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->compressions).
            super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_88 = (long *)CONCAT44(local_88._4_4_,10);
          if (iVar8._M_current ==
              (this->compressions).
              super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
            _M_realloc_insert<Imf_3_4::Compression>
                      (&this->compressions,iVar8,(Compression *)&local_88);
            return 0;
          }
          *iVar8._M_current = NUM_COMPRESSION_METHODS;
          (this->compressions).
          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          return 0;
        }
        return 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Nothing to do: no output file specified, and all performance/size data disabled",
                 0x4f);
      pcVar10 = "Use -o to specify output image filename\n";
      lVar7 = 0x28;
      poVar11 = (ostream *)&std::cerr;
LAB_00108a7f:
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar10,lVar7);
    }
    return 1;
  }
  local_48 = &this->inFiles;
  local_8c = argc + -2;
  local_68 = &this->pixelModes;
  this_00 = &this->compressions;
  iVar14 = 1;
LAB_00108134:
  pcVar10 = local_38[iVar14];
  cVar1 = *pcVar10;
  if ((((cVar1 == '-') && (pcVar10[1] == 'h')) && (pcVar10[2] == '\0')) ||
     (iVar4 = strcmp(pcVar10,"--help"), iVar4 == 0)) {
    usageMessage((ostream *)&std::cout,"exrmetrics",true);
    return 0;
  }
  iVar4 = strcmp(pcVar10,"--version");
  if (iVar4 == 0) {
    pcVar10 = (char *)Imf_3_4::getLibraryVersion();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"exrmetrics (OpenEXR) ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.4.0",5);
    iVar14 = strcmp(pcVar10,"3.4.0");
    if (iVar14 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"(OpenEXR version ",0x11);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x117320);
      }
      else {
        sVar5 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," https://openexr.com",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    return 0;
  }
  __x = local_38 + iVar14;
  if (cVar1 == '-') {
    if ((pcVar10[1] == 'm') && (pcVar10[2] == '\0')) {
      this->threads = -1;
      goto LAB_00108617;
    }
    if ((pcVar10[1] != 't') || (pcVar10[2] != '\0')) goto LAB_001081c4;
    if (local_8c < iVar14) {
      poVar11 = (ostream *)&std::cerr;
      pcVar10 = "Missing thread count value with -t option\n";
      lVar7 = 0x2a;
      goto LAB_00108a7f;
    }
    iVar4 = atoi(__x[1]);
    this->threads = iVar4;
    if (iVar4 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"bad thread count ",0x11);
      pcVar10 = __x[1];
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x117530);
      }
      else {
        sVar5 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar5);
      }
      poVar11 = (ostream *)&std::cerr;
      pcVar10 = " specified to -t option\n";
      lVar7 = 0x18;
      goto LAB_00108a7f;
    }
LAB_001083f6:
    iVar14 = iVar14 + 2;
  }
  else {
LAB_001081c4:
    iVar4 = strcmp(pcVar10,"--bench");
    if (iVar4 == 0) {
      pCVar2 = (this->compressions).
               super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->compressions).
          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
          super__Vector_impl_data._M_finish != pCVar2) {
        (this->compressions).
        super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar2;
      }
      CVar13 = NO_COMPRESSION;
      do {
        local_88 = (long *)CONCAT44(local_88._4_4_,CVar13);
        iVar8._M_current =
             (this->compressions).
             super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->compressions).
            super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
          _M_realloc_insert<Imf_3_4::Compression>(this_00,iVar8,(Compression *)&local_88);
        }
        else {
          *iVar8._M_current = CVar13;
          (this->compressions).
          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        CVar13 = CVar13 + RLE_COMPRESSION;
      } while (CVar13 != NUM_COMPRESSION_METHODS);
      this->passes = 10;
      this->timing = 6;
      this->outputSizeData = false;
      this->csv = true;
      this->part = -1;
      std::vector<PixelMode,_std::allocator<PixelMode>_>::resize(local_68,2);
      pPVar3 = (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar3[0] = PIXELMODE_ALL_HALF;
      pPVar3[1] = PIXELMODE_ALL_FLOAT;
      iVar14 = iVar14 + 1;
      goto LAB_00108622;
    }
    iVar4 = strcmp(pcVar10,"--convert");
    if (iVar4 == 0) {
      std::vector<PixelMode,_std::allocator<PixelMode>_>::resize(local_68,1);
      *(this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
       super__Vector_impl_data._M_start = PIXELMODE_ORIGINAL;
      this->passes = 1;
      this->timing = 0;
      this->outputSizeData = false;
      this->part = -1;
      goto LAB_00108617;
    }
    iVar4 = strcmp(pcVar10,"--passes");
    if (iVar4 == 0) {
      if (local_8c < iVar14) {
        pcVar10 = "Missing pass count value with --passes option\n";
LAB_00108d61:
        poVar11 = (ostream *)&std::cerr;
        lVar7 = 0x2e;
      }
      else {
        iVar4 = atoi(__x[1]);
        this->passes = iVar4;
        if (-1 < iVar4) goto LAB_001083f6;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bad value for passes ",0x15);
        poVar11 = std::operator<<((ostream *)&std::cerr,__x[1]);
        pcVar10 = " specified to --passes option\n";
        lVar7 = 0x1e;
      }
      goto LAB_00108a7f;
    }
    if (((cVar1 == '-') && (pcVar10[1] == 'v')) && (pcVar10[2] == '\0')) {
      this->verbose = true;
    }
    else {
      iVar4 = strcmp(pcVar10,"--csv");
      if (iVar4 == 0) {
        this->csv = true;
      }
      else {
        iVar4 = strcmp(pcVar10,"--json");
        if (iVar4 == 0) {
          this->csv = false;
        }
        else {
          if (cVar1 == '-') {
            if (((pcVar10[1] == 'z') && (pcVar10[2] == '\0')) ||
               (iVar4 = strcmp(pcVar10,"--compression"), iVar4 == 0)) {
LAB_001084ae:
              pCVar2 = (this->compressions).
                       super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((this->compressions).
                  super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
                  _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
                (this->compressions).
                super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>.
                _M_impl.super__Vector_impl_data._M_finish = pCVar2;
              }
              if (local_8c < iVar14) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Missing compression value with ",0x1f);
                poVar11 = std::operator<<((ostream *)&std::cerr,*__x);
                pcVar10 = " option\n";
                lVar7 = 8;
                goto LAB_00108a7f;
              }
              split_abi_cxx11_((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_60,__x[1],',');
              p_Var15 = local_60._M_impl._M_node.super__List_node_base._M_next;
              if (local_60._M_impl._M_node.super__List_node_base._M_next !=
                  (_List_node_base *)&local_60) {
                do {
                  local_88 = local_78;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_88,p_Var15[1]._M_next,
                             (long)&(p_Var15[1]._M_prev)->_M_next + (long)p_Var15[1]._M_next);
                  iVar4 = std::__cxx11::string::compare((char *)&local_88);
                  if (iVar4 == 0) {
                    local_90 = 10;
                    iVar8._M_current =
                         (this->compressions).
                         super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    if (iVar8._M_current ==
                        (this->compressions).
                        super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
                      _M_realloc_insert<Imf_3_4::Compression>(this_00,iVar8,&local_90);
                    }
                    else {
                      *iVar8._M_current = NUM_COMPRESSION_METHODS;
LAB_00108574:
                      (this->compressions).
                      super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                      ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                    }
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_88);
                    if (iVar4 == 0) {
                      PVar12 = PIXELMODE_ORIGINAL;
                      do {
                        iVar8._M_current =
                             (this->compressions).
                             super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                        local_90 = PVar12;
                        if (iVar8._M_current ==
                            (this->compressions).
                            super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>::
                          _M_realloc_insert<Imf_3_4::Compression>(this_00,iVar8,&local_90);
                        }
                        else {
                          *iVar8._M_current = PVar12;
                          (this->compressions).
                          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                          ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                        }
                        PVar12 = PVar12 + PIXELMODE_ALL_HALF;
                      } while (PVar12 != 10);
                    }
                    else {
                      Imf_3_4::getCompressionIdFromName((string *)&local_88,&local_90);
                      if (local_90 == 10) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"unknown compression type ",0x19);
                        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cerr,(char *)local_88,local_80);
                        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) +
                                        (char)poVar11);
                        std::ostream::put((char)poVar11);
                        std::ostream::flush();
                        goto LAB_00108d28;
                      }
                      iVar8._M_current =
                           (this->compressions).
                           super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar8._M_current !=
                          (this->compressions).
                          super__Vector_base<Imf_3_4::Compression,_std::allocator<Imf_3_4::Compression>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        *iVar8._M_current = local_90;
                        goto LAB_00108574;
                      }
                      std::vector<Imf_3_4::Compression,std::allocator<Imf_3_4::Compression>>::
                      _M_realloc_insert<Imf_3_4::Compression_const&>
                                ((vector<Imf_3_4::Compression,std::allocator<Imf_3_4::Compression>>
                                  *)this_00,iVar8,&local_90);
                    }
                  }
                  if (local_88 != local_78) {
                    operator_delete(local_88,local_78[0] + 1);
                  }
                  p_Var15 = p_Var15->_M_next;
                } while (p_Var15 != (_List_node_base *)&local_60);
              }
              goto LAB_001085fe;
            }
            if ((pcVar10[1] == 'p') && (pcVar10[2] == '\0')) {
              if (iVar14 <= local_8c) {
                pcVar10 = __x[1];
                iVar4 = strcmp(pcVar10,"all");
                if (iVar4 == 0) {
                  this->part = -1;
                }
                else {
                  iVar4 = atoi(pcVar10);
                  this->part = iVar4;
                  if (iVar4 < -1) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"bad part ",9);
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->part);
                    pcVar10 = " specified to -p option\n";
                    goto LAB_00108fd5;
                  }
                }
LAB_00108a05:
                iVar14 = iVar14 + 2;
                goto LAB_00108622;
              }
              pcVar10 = "Missing part number with -p option\n";
LAB_00108f8b:
              poVar11 = (ostream *)&std::cerr;
              lVar7 = 0x23;
              goto LAB_00108a7f;
            }
            if ((pcVar10[1] == 'l') && (pcVar10[2] == '\0')) {
              if (local_8c < iVar14) {
                pcVar10 = "Missing compression level number with -l option\n";
                goto LAB_00108f3f;
              }
              dVar16 = atof(__x[1]);
              this->level = (float)dVar16;
              if (0.0 <= (float)dVar16) goto LAB_001083f6;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"bad level ",10);
              poVar11 = std::ostream::_M_insert<double>((double)this->level);
              pcVar10 = " specified to -l option\n";
LAB_00108fd5:
              lVar7 = 0x18;
              goto LAB_00108a7f;
            }
            if ((pcVar10[1] != 'o') || (pcVar10[2] != '\0')) goto LAB_00108428;
            if (local_8c < iVar14) {
              pcVar10 = "Missing filename specified with -o\n";
              goto LAB_00108f8b;
            }
            if (this->outFile != (char *)0x0) {
              pcVar10 = "-o output filename can only be specified once\n";
              goto LAB_00108d61;
            }
            this->outFile = __x[1];
            goto LAB_001083f6;
          }
          iVar4 = strcmp(pcVar10,"--compression");
          if (iVar4 == 0) goto LAB_001084ae;
LAB_00108428:
          iVar4 = strcmp(pcVar10,"-16");
          if (iVar4 == 0) {
            if (iVar14 <= local_8c) {
              pcVar10 = __x[1];
              iVar4 = strcmp(pcVar10,"all");
              if (iVar4 == 0) {
                local_88 = (long *)CONCAT44(local_88._4_4_,1);
                iVar9._M_current =
                     (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar9._M_current ==
                    (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_00108970:
                  std::vector<PixelMode,_std::allocator<PixelMode>_>::_M_realloc_insert<PixelMode>
                            (local_68,iVar9,(PixelMode *)&local_88);
                  goto LAB_00108a05;
                }
                *iVar9._M_current = PIXELMODE_ALL_HALF;
              }
              else {
                iVar4 = strcmp(pcVar10,"rgba");
                if (iVar4 != 0) {
                  poVar11 = (ostream *)&std::cerr;
                  pcVar10 = " bad mode for -16 option: must be \'all\' or \'rgba\'\n";
                  lVar7 = 0x32;
                  goto LAB_00108a7f;
                }
                local_88 = (long *)CONCAT44(local_88._4_4_,3);
                iVar9._M_current =
                     (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar9._M_current ==
                    (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00108970;
                *iVar9._M_current = PIXELMODE_MIXED_HALF_FLOAT;
              }
              (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
              goto LAB_00108a05;
            }
            poVar11 = (ostream *)&std::cerr;
            pcVar10 = "Missing mode with -16 option\n";
            lVar7 = 0x1d;
            goto LAB_00108a7f;
          }
          iVar4 = strcmp(pcVar10,"--pixelmode");
          if (iVar4 == 0) {
            if (local_8c < iVar14) {
              pcVar10 = "Missing type list with  with --pixelmode option\n";
LAB_00108f3f:
              poVar11 = (ostream *)&std::cerr;
              lVar7 = 0x30;
              goto LAB_00108a7f;
            }
            split_abi_cxx11_((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_60,__x[1],',');
            pPVar3 = (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl
                .super__Vector_impl_data._M_finish != pPVar3) {
              (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
              super__Vector_impl_data._M_finish = pPVar3;
            }
            p_Var15 = local_60._M_impl._M_node.super__List_node_base._M_next;
            if (local_60._M_impl._M_node.super__List_node_base._M_next !=
                (_List_node_base *)&local_60) {
              do {
                local_88 = local_78;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_88,p_Var15[1]._M_next,
                           (long)&(p_Var15[1]._M_prev)->_M_next + (long)p_Var15[1]._M_next);
                iVar4 = std::__cxx11::string::compare((char *)&local_88);
                if (iVar4 == 0) {
                  local_90 = PIXELMODE_ALL_HALF;
                  iVar9._M_current =
                       (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar9._M_current ==
                      (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<PixelMode,_std::allocator<PixelMode>_>::_M_realloc_insert<PixelMode>
                              (local_68,iVar9,&local_90);
                  }
                  else {
                    *iVar9._M_current = PIXELMODE_ALL_HALF;
LAB_001087c9:
                    (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_88);
                  if (iVar4 == 0) {
                    local_90 = PIXELMODE_ALL_FLOAT;
                    iVar9._M_current =
                         (this->pixelModes).
                         super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar9._M_current !=
                        (this->pixelModes).super__Vector_base<PixelMode,_std::allocator<PixelMode>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      *iVar9._M_current = PIXELMODE_ALL_FLOAT;
                      goto LAB_001087c9;
                    }
                    std::vector<PixelMode,_std::allocator<PixelMode>_>::_M_realloc_insert<PixelMode>
                              (local_68,iVar9,&local_90);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_88);
                    if ((iVar4 == 0) ||
                       (iVar4 = std::__cxx11::string::compare((char *)&local_88), iVar4 == 0)) {
                      local_90 = PIXELMODE_MIXED_HALF_FLOAT;
                      iVar9._M_current =
                           (this->pixelModes).
                           super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar9._M_current !=
                          (this->pixelModes).
                          super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        *iVar9._M_current = PIXELMODE_MIXED_HALF_FLOAT;
                        goto LAB_001087c9;
                      }
                      std::vector<PixelMode,_std::allocator<PixelMode>_>::
                      _M_realloc_insert<PixelMode>(local_68,iVar9,&local_90);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_88);
                      if (iVar4 != 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"bad pixel type ",0xf);
                        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cerr,(char *)local_88,local_80);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,
                                   " for --pixelmode: must be half,float,rgba,mixed or orig\n",0x38)
                        ;
                        goto LAB_00108d28;
                      }
                      local_90 = PIXELMODE_ORIGINAL;
                      iVar9._M_current =
                           (this->pixelModes).
                           super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar9._M_current !=
                          (this->pixelModes).
                          super__Vector_base<PixelMode,_std::allocator<PixelMode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        *iVar9._M_current = PIXELMODE_ORIGINAL;
                        goto LAB_001087c9;
                      }
                      std::vector<PixelMode,_std::allocator<PixelMode>_>::
                      _M_realloc_insert<PixelMode>(local_68,iVar9,&local_90);
                    }
                  }
                }
                if (local_88 != local_78) {
                  operator_delete(local_88,local_78[0] + 1);
                }
                p_Var15 = p_Var15->_M_next;
              } while (p_Var15 != (_List_node_base *)&local_60);
            }
LAB_001085fe:
            iVar14 = iVar14 + 2;
            std::__cxx11::
            _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_clear(&local_60);
            goto LAB_00108622;
          }
          iVar4 = strcmp(pcVar10,"--time");
          if (iVar4 == 0) {
            if (iVar14 <= local_8c) {
              this->timing = 0;
              pcVar10 = __x[1];
              iVar4 = strcmp(pcVar10,"none");
              if (iVar4 != 0) {
                split_abi_cxx11_((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_60,pcVar10,',');
                p_Var15 = local_60._M_impl._M_node.super__List_node_base._M_next;
                if (local_60._M_impl._M_node.super__List_node_base._M_next !=
                    (_List_node_base *)&local_60) {
                  do {
                    local_88 = local_78;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_88,p_Var15[1]._M_next,
                               (long)&(p_Var15[1]._M_prev)->_M_next + (long)p_Var15[1]._M_next);
                    iVar4 = std::__cxx11::string::compare((char *)&local_88);
                    if (iVar4 == 0) {
                      uVar6 = 1;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_88);
                      if (iVar4 == 0) {
                        uVar6 = 4;
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)&local_88);
                        uVar6 = 2;
                        if (iVar4 != 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,
                                     "bad value in timing list. Options are read,write,reread\n",
                                     0x38);
LAB_00108d28:
                          if (local_88 != local_78) {
                            operator_delete(local_88,local_78[0] + 1);
                          }
                          std::__cxx11::
                          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::_M_clear(&local_60);
                          return 1;
                        }
                      }
                    }
                    this->timing = this->timing | uVar6;
                    if (local_88 != local_78) {
                      operator_delete(local_88,local_78[0] + 1);
                    }
                    p_Var15 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base.
                              _M_next;
                  } while (p_Var15 != (_List_node_base *)&local_60);
                }
                std::__cxx11::
                _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_clear(&local_60);
              }
              goto LAB_00108a05;
            }
            poVar11 = (ostream *)&std::cerr;
            pcVar10 = "Missing value list with --time option\n";
            lVar7 = 0x26;
            goto LAB_00108a7f;
          }
          iVar4 = strcmp(pcVar10,"--no-size");
          if (iVar4 == 0) {
            this->outputSizeData = false;
            goto LAB_00108617;
          }
          if (((cVar1 == '-') && (pcVar10[1] == 'i')) && (pcVar10[2] == '\0')) {
            if (iVar14 <= local_8c) {
              std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(local_48,__x + 1);
              goto LAB_001083f6;
            }
            poVar11 = (ostream *)&std::cerr;
            pcVar10 = "Missing filename with -i option\n";
            lVar7 = 0x20;
            goto LAB_00108a7f;
          }
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(local_48,__x);
        }
      }
    }
LAB_00108617:
    iVar14 = iVar14 + 1;
  }
LAB_00108622:
  if ((int)local_40 <= iVar14) goto LAB_00108a39;
  goto LAB_00108134;
}

Assistant:

int
options::parse (int argc, char* argv[])
{

    int i = 1;

    timing = TIME_READ | TIME_WRITE | TIME_REREAD;

    if (argc == 1)
    {
        usageMessage (cerr, "exrmetrics", true);
        return 1;
    }

    while (i < argc)
    {
        if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            usageMessage (cout, "exrmetrics", true);
            return 0;
        }

        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion ();

            cout << "exrmetrics (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;
            return 0;
        }
        else if (!strcmp (argv[i], "-m"))
        {
            threads = -1;
            i += 1;
        }
        else if (!strcmp (argv[i], "-t"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing thread count value with -t option\n";
                return 1;
            }

            threads = atoi (argv[i + 1]);
            if (threads < 0)
            {
                cerr << "bad thread count " << argv[i + 1]
                     << " specified to -t option\n";
                return 1;
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "--bench"))
        {
            compressions.clear ();
            for (int c = 0; c < NUM_COMPRESSION_METHODS; ++c)
            {
                compressions.push_back (Compression (c));
            }
            passes         = 10;
            outputSizeData = false;
            csv            = true;
            part           = -1;
            timing         = TIME_WRITE | TIME_REREAD;
            pixelModes.resize (2);
            pixelModes[0] = PIXELMODE_ALL_HALF;
            pixelModes[1] = PIXELMODE_ALL_FLOAT;
            i += 1;
        }
        else if (!strcmp (argv[i], "--convert"))
        {
            pixelModes.resize (1);
            pixelModes[0]  = PIXELMODE_ORIGINAL;
            passes         = 1;
            outputSizeData = false;
            timing         = 0;
            part           = -1;
            i += 1;
        }
        else if (!strcmp (argv[i], "--passes"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing pass count value with --passes option\n";
                return 1;
            }
            passes = atoi (argv[i + 1]);
            if (passes < 0)
            {
                cerr << "bad value for passes " << argv[i + 1]
                     << " specified to --passes option\n";
                return 1;
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "-v"))
        {
            verbose = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "--csv"))
        {
            csv = true;
            i += 1;
        }
        else if (!strcmp (argv[i], "--json"))
        {
            csv = false;
            i += 1;
        }
        else if (!strcmp (argv[i], "-z") || !strcmp (argv[i], "--compression"))
        {
            compressions.clear ();
            if (i > argc - 2)
            {
                cerr << "Missing compression value with " << argv[i]
                     << " option\n";
                return 1;
            }
            std::list<string> items = split (argv[i + 1], ',');

            for (string i: items)
            {

                if (i == "orig")
                {
                    compressions.push_back (NUM_COMPRESSION_METHODS);
                }
                else if (i == "all")
                {
                    for (int c = 0; c < NUM_COMPRESSION_METHODS; ++c)
                    {
                        compressions.push_back (Compression (c));
                    }
                }
                else
                {
                    Compression compression;
                    getCompressionIdFromName (i, compression);
                    if (compression == Compression::NUM_COMPRESSION_METHODS)
                    {
                        cerr << "unknown compression type " << i << endl;
                        return 1;
                    }
                    compressions.push_back (compression);
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "-p"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing part number with -p option\n";
                return 1;
            }
            if (!strcmp (argv[i + 1], "all")) { part = -1; }
            else
            {
                part = atoi (argv[i + 1]);
                if (part < -1)
                {
                    cerr << "bad part " << part << " specified to -p option\n";
                    return 1;
                }
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "-l"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing compression level number with -l option\n";
                return 1;
            }
            level = atof (argv[i + 1]);
            if (level < 0)
            {
                cerr << "bad level " << level << " specified to -l option\n";
                return 1;
            }

            i += 2;
        }
        else if (!strcmp (argv[i], "-o"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing filename specified with -o\n";
                return 1;
            }
            if (outFile)
            {
                cerr << "-o output filename can only be specified once\n";
                return 1;
            }
            outFile = argv[i + 1];
            i += 2;
        }
        // deprecated flag for backwards compatibility
        else if (!strcmp (argv[i], "-16"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing mode with -16 option\n";
                return 1;
            }
            if (!strcmp (argv[i + 1], "all"))
            {
                pixelModes.push_back (PIXELMODE_ALL_HALF);
            }
            else if (!strcmp (argv[i + 1], "rgba"))
            {
                pixelModes.push_back (PIXELMODE_MIXED_HALF_FLOAT);
            }
            else
            {
                cerr << " bad mode for -16 option: must be 'all' or 'rgba'\n";
                return 1;
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--pixelmode"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing type list with  with --pixelmode option\n";
                return 1;
            }
            std::list<string> items = split (argv[i + 1], ',');
            pixelModes.clear ();
            for (string i: items)
            {
                if (i == "half") { pixelModes.push_back (PIXELMODE_ALL_HALF); }
                else if (i == "float")
                {
                    pixelModes.push_back (PIXELMODE_ALL_FLOAT);
                }
                else if (i == "rgba" || i == "mixed")
                {
                    pixelModes.push_back (PIXELMODE_MIXED_HALF_FLOAT);
                }
                else if (i == "orig")
                {
                    pixelModes.push_back (PIXELMODE_ORIGINAL);
                }
                else
                {
                    cerr
                        << "bad pixel type " << i
                        << " for --pixelmode: must be half,float,rgba,mixed or orig\n";
                    return 1;
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--time"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing value list with --time option\n";
                return 1;
            }

            timing = TIME_NONE;
            if (strcmp (argv[i + 1], "none"))
            {
                std::list<string> items = split (argv[i + 1], ',');
                for (string i: items)
                {
                    if (i == "read") { timing |= TIME_READ; }
                    else if (i == "reread") { timing |= TIME_REREAD; }
                    else if (i == "write") { timing |= TIME_WRITE; }
                    else
                    {
                        cerr
                            << "bad value in timing list. Options are read,write,reread\n";
                        return 1;
                    }
                }
            }
            i += 2;
        }
        else if (!strcmp (argv[i], "--no-size"))
        {
            outputSizeData = false;
            i += 1;
        }
        else if (!strcmp (argv[i], "-i"))
        {
            if (i > argc - 2)
            {
                cerr << "Missing filename with -i option\n";
                return 1;
            }
            inFiles.push_back (argv[i + 1]);
            i += 2;
        }
        else
        {
            inFiles.push_back (argv[i]);
            i += 1;
        }
    }
    if (inFiles.size () == 0)
    {
        cerr << "Missing input file\n";
        usageMessage (cerr, "exrmetrics", false);
        return 1;
    }

    if (!outputSizeData && !timing && !outFile)
    {
        cerr
            << "Nothing to do: no output file specified, and all performance/size data disabled";
        cerr << "Use -o to specify output image filename\n";
        return 1;
    }

    // default options if none specified
    if (pixelModes.size () == 0) { pixelModes.push_back (PIXELMODE_ORIGINAL); }

    if (compressions.size () == 0)
    {
        compressions.push_back (NUM_COMPRESSION_METHODS);
    }

    return 0;
}